

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O0

CURLcode rtsp_do(connectdata *conn,_Bool *done)

{
  CURLcode CVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  Curl_send_buffer *local_170;
  char *local_150;
  size_t local_148;
  size_t local_140;
  char *local_138;
  char *local_128;
  char *local_118;
  char *local_108;
  char *local_f8;
  char *local_e8;
  char *local_d8;
  char *local_c8;
  char *p_userpwd;
  char *p_proxyuserpwd;
  char *p_uagent;
  char *p_transport;
  char *p_stream_uri;
  char *p_referrer;
  char *p_range;
  char *p_accept_encoding;
  char *p_accept;
  char *p_session_id;
  char *p_request;
  curl_off_t putsize;
  curl_off_t postsize;
  Curl_send_buffer *req_buffer;
  HTTP *http;
  RTSP *rtsp;
  Curl_RtspReq rtspreq;
  CURLcode result;
  Curl_easy *data;
  _Bool *done_local;
  connectdata *conn_local;
  
  _rtspreq = conn->data;
  rtsp._4_4_ = CURLE_OK;
  rtsp._0_4_ = (_rtspreq->set).rtspreq;
  req_buffer = (Curl_send_buffer *)(_rtspreq->req).protop;
  putsize = 0;
  p_request = (char *)0x0;
  p_accept_encoding = (char *)0x0;
  p_range = (char *)0x0;
  p_referrer = (char *)0x0;
  p_proxyuserpwd = (char *)0x0;
  *done = true;
  ((HTTP *)((long)req_buffer + 0x228))->sendit =
       (curl_mimepart *)(_rtspreq->state).rtsp_next_client_CSeq;
  ((HTTP *)((long)req_buffer + 0x228))->postsize = 0;
  (_rtspreq->set).opt_no_body = true;
  http = (HTTP *)req_buffer;
  data = (Curl_easy *)done;
  done_local = (_Bool *)conn;
  switch((Curl_RtspReq)rtsp) {
  case RTSPREQ_OPTIONS:
    p_session_id = "OPTIONS";
    break;
  case RTSPREQ_DESCRIBE:
    p_session_id = "DESCRIBE";
    (_rtspreq->set).opt_no_body = false;
    break;
  case RTSPREQ_ANNOUNCE:
    p_session_id = "ANNOUNCE";
    break;
  case RTSPREQ_SETUP:
    p_session_id = "SETUP";
    break;
  case RTSPREQ_PLAY:
    p_session_id = "PLAY";
    break;
  case RTSPREQ_PAUSE:
    p_session_id = "PAUSE";
    break;
  case RTSPREQ_TEARDOWN:
    p_session_id = "TEARDOWN";
    break;
  case RTSPREQ_GET_PARAMETER:
    p_session_id = "GET_PARAMETER";
    (_rtspreq->set).opt_no_body = false;
    break;
  case RTSPREQ_SET_PARAMETER:
    p_session_id = "SET_PARAMETER";
    break;
  case RTSPREQ_RECORD:
    p_session_id = "RECORD";
    break;
  case RTSPREQ_RECEIVE:
    p_session_id = "";
    (_rtspreq->set).opt_no_body = false;
    break;
  case RTSPREQ_LAST:
    Curl_failf(_rtspreq,"Got invalid RTSP request: RTSPREQ_LAST");
    return CURLE_BAD_FUNCTION_ARGUMENT;
  default:
    Curl_failf(_rtspreq,"Got invalid RTSP request");
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  if ((Curl_RtspReq)rtsp == RTSPREQ_RECEIVE) {
    Curl_setup_transfer(conn,0,-1,true,&((HTTP *)req_buffer)->readbytecount,-1,(curl_off_t *)0x0);
    conn_local._4_4_ = rtsp._4_4_;
  }
  else {
    pcVar4 = (_rtspreq->set).str[0x32];
    if ((pcVar4 == (char *)0x0) && (((Curl_RtspReq)rtsp & ~RTSPREQ_TEARDOWN) != RTSPREQ_NONE)) {
      Curl_failf(_rtspreq,"Refusing to issue an RTSP request [%s] without a session ID.",
                 p_session_id);
      conn_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
    }
    else {
      if ((_rtspreq->set).str[0x33] == (char *)0x0) {
        p_transport = "*";
      }
      else {
        p_transport = (_rtspreq->set).str[0x33];
      }
      p_uagent = Curl_checkheaders(conn,"Transport");
      if (((Curl_RtspReq)rtsp == RTSPREQ_SETUP) && (p_uagent == (char *)0x0)) {
        if ((_rtspreq->set).str[0x34] == (char *)0x0) {
          Curl_failf(_rtspreq,"Refusing to issue an RTSP SETUP without a Transport: header.");
          return CURLE_BAD_FUNCTION_ARGUMENT;
        }
        (*Curl_cfree)(*(void **)(done_local + 0x458));
        done_local[0x458] = false;
        done_local[0x459] = false;
        done_local[0x45a] = false;
        done_local[0x45b] = false;
        done_local[0x45c] = false;
        done_local[0x45d] = false;
        done_local[0x45e] = false;
        done_local[0x45f] = false;
        pcVar3 = curl_maprintf("Transport: %s\r\n",(_rtspreq->set).str[0x34]);
        *(char **)(done_local + 0x458) = pcVar3;
        if (*(long *)(done_local + 0x458) == 0) {
          return CURLE_OUT_OF_MEMORY;
        }
        p_uagent = *(char **)(done_local + 0x458);
      }
      if ((Curl_RtspReq)rtsp == RTSPREQ_DESCRIBE) {
        pcVar3 = Curl_checkheaders((connectdata *)done_local,"Accept");
        p_accept_encoding = "Accept: application/sdp\r\n";
        if (pcVar3 != (char *)0x0) {
          p_accept_encoding = (char *)0x0;
        }
        pcVar3 = Curl_checkheaders((connectdata *)done_local,"Accept-Encoding");
        if ((pcVar3 == (char *)0x0) && ((_rtspreq->set).str[9] != (char *)0x0)) {
          (*Curl_cfree)(*(void **)(done_local + 0x428));
          done_local[0x428] = false;
          done_local[0x429] = false;
          done_local[0x42a] = false;
          done_local[0x42b] = false;
          done_local[0x42c] = false;
          done_local[0x42d] = false;
          done_local[0x42e] = false;
          done_local[0x42f] = false;
          pcVar3 = curl_maprintf("Accept-Encoding: %s\r\n",(_rtspreq->set).str[9]);
          *(char **)(done_local + 0x428) = pcVar3;
          if (*(long *)(done_local + 0x428) == 0) {
            return CURLE_OUT_OF_MEMORY;
          }
          p_range = *(char **)(done_local + 0x428);
        }
      }
      pcVar3 = Curl_checkheaders((connectdata *)done_local,"User-Agent");
      if ((pcVar3 == (char *)0x0) || (*(long *)(done_local + 0x420) == 0)) {
        pcVar3 = Curl_checkheaders((connectdata *)done_local,"User-Agent");
        if ((pcVar3 == (char *)0x0) && ((_rtspreq->set).str[0x26] != (char *)0x0)) {
          p_proxyuserpwd = *(char **)(done_local + 0x420);
        }
      }
      else {
        (*Curl_cfree)(*(void **)(done_local + 0x420));
        done_local[0x420] = false;
        done_local[0x421] = false;
        done_local[0x422] = false;
        done_local[0x423] = false;
        done_local[0x424] = false;
        done_local[0x425] = false;
        done_local[0x426] = false;
        done_local[0x427] = false;
        done_local[0x420] = false;
        done_local[0x421] = false;
        done_local[0x422] = false;
        done_local[0x423] = false;
        done_local[0x424] = false;
        done_local[0x425] = false;
        done_local[0x426] = false;
        done_local[0x427] = false;
      }
      rtsp._4_4_ = Curl_http_output_auth((connectdata *)done_local,p_session_id,p_transport,false);
      conn_local._4_4_ = rtsp._4_4_;
      if (rtsp._4_4_ == CURLE_OK) {
        local_128 = *(char **)(done_local + 0x418);
        local_138 = *(char **)(done_local + 0x430);
        (*Curl_cfree)(*(void **)(done_local + 0x440));
        done_local[0x440] = false;
        done_local[0x441] = false;
        done_local[0x442] = false;
        done_local[0x443] = false;
        done_local[0x444] = false;
        done_local[0x445] = false;
        done_local[0x446] = false;
        done_local[0x447] = false;
        if (((_rtspreq->change).referer == (char *)0x0) ||
           (pcVar3 = Curl_checkheaders((connectdata *)done_local,"Referer"), pcVar3 != (char *)0x0))
        {
          done_local[0x440] = false;
          done_local[0x441] = false;
          done_local[0x442] = false;
          done_local[0x443] = false;
          done_local[0x444] = false;
          done_local[0x445] = false;
          done_local[0x446] = false;
          done_local[0x447] = false;
        }
        else {
          pcVar3 = curl_maprintf("Referer: %s\r\n",(_rtspreq->change).referer);
          *(char **)(done_local + 0x440) = pcVar3;
        }
        local_108 = *(char **)(done_local + 0x440);
        if ((((((_rtspreq->state).use_range & 1U) != 0) &&
             (((Curl_RtspReq)rtsp & (RTSPREQ_LAST|RTSPREQ_ANNOUNCE)) != RTSPREQ_NONE)) &&
            (pcVar3 = Curl_checkheaders((connectdata *)done_local,"Range"), pcVar3 == (char *)0x0))
           && ((_rtspreq->state).range != (char *)0x0)) {
          (*Curl_cfree)(*(void **)(done_local + 0x438));
          done_local[0x438] = false;
          done_local[0x439] = false;
          done_local[0x43a] = false;
          done_local[0x43b] = false;
          done_local[0x43c] = false;
          done_local[0x43d] = false;
          done_local[0x43e] = false;
          done_local[0x43f] = false;
          pcVar3 = curl_maprintf("Range: %s\r\n",(_rtspreq->state).range);
          *(char **)(done_local + 0x438) = pcVar3;
          p_referrer = *(char **)(done_local + 0x438);
        }
        pcVar3 = Curl_checkheaders((connectdata *)done_local,"CSeq");
        if (pcVar3 == (char *)0x0) {
          pcVar3 = Curl_checkheaders((connectdata *)done_local,"Session");
          if (pcVar3 == (char *)0x0) {
            postsize = (curl_off_t)Curl_add_buffer_init();
            if ((Curl_send_buffer *)postsize == (Curl_send_buffer *)0x0) {
              conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
            }
            else {
              rtsp._4_4_ = Curl_add_bufferf((Curl_send_buffer **)&postsize,
                                            "%s %s RTSP/1.0\r\nCSeq: %ld\r\n",p_session_id,
                                            p_transport,http[1].sendit);
              conn_local._4_4_ = rtsp._4_4_;
              if ((rtsp._4_4_ == CURLE_OK) &&
                 ((pcVar4 == (char *)0x0 ||
                  (conn_local._4_4_ =
                        Curl_add_bufferf((Curl_send_buffer **)&postsize,"Session: %s\r\n",pcVar4),
                  conn_local._4_4_ == CURLE_OK)))) {
                rtsp._4_4_ = 0;
                if (p_uagent == (char *)0x0) {
                  local_c8 = "";
                }
                else {
                  local_c8 = p_uagent;
                }
                if (p_accept_encoding == (char *)0x0) {
                  local_d8 = "";
                }
                else {
                  local_d8 = p_accept_encoding;
                }
                if (p_range == (char *)0x0) {
                  local_e8 = "";
                }
                else {
                  local_e8 = p_range;
                }
                if (p_referrer == (char *)0x0) {
                  local_f8 = "";
                }
                else {
                  local_f8 = p_referrer;
                }
                if (local_108 == (char *)0x0) {
                  local_108 = "";
                }
                if (p_proxyuserpwd == (char *)0x0) {
                  local_118 = "";
                }
                else {
                  local_118 = p_proxyuserpwd;
                }
                if (local_128 == (char *)0x0) {
                  local_128 = "";
                }
                if (local_138 == (char *)0x0) {
                  local_138 = "";
                }
                rtsp._4_4_ = Curl_add_bufferf((Curl_send_buffer **)&postsize,"%s%s%s%s%s%s%s%s",
                                              local_c8,local_d8,local_e8,local_f8,local_108,
                                              local_118,local_128,local_138);
                (*Curl_cfree)(*(void **)(done_local + 0x430));
                done_local[0x430] = false;
                done_local[0x431] = false;
                done_local[0x432] = false;
                done_local[0x433] = false;
                done_local[0x434] = false;
                done_local[0x435] = false;
                done_local[0x436] = false;
                done_local[0x437] = false;
                done_local[0x430] = false;
                done_local[0x431] = false;
                done_local[0x432] = false;
                done_local[0x433] = false;
                done_local[0x434] = false;
                done_local[0x435] = false;
                done_local[0x436] = false;
                done_local[0x437] = false;
                if (rtsp._4_4_ == CURLE_OK) {
                  if (((Curl_RtspReq)rtsp == RTSPREQ_SETUP) ||
                     ((Curl_RtspReq)rtsp == RTSPREQ_DESCRIBE)) {
                    CVar1 = Curl_add_timecondition(_rtspreq,(Curl_send_buffer *)postsize);
                    if (CVar1 != CURLE_OK) {
                      return CVar1;
                    }
                    rtsp._4_4_ = CURLE_OK;
                  }
                  rtsp._4_4_ = Curl_add_custom_headers
                                         ((connectdata *)done_local,false,
                                          (Curl_send_buffer *)postsize);
                  conn_local._4_4_ = rtsp._4_4_;
                  if (rtsp._4_4_ == CURLE_OK) {
                    if ((((Curl_RtspReq)rtsp == RTSPREQ_ANNOUNCE) ||
                        ((Curl_RtspReq)rtsp == RTSPREQ_SET_PARAMETER)) ||
                       ((Curl_RtspReq)rtsp == RTSPREQ_GET_PARAMETER)) {
                      if (((_rtspreq->set).upload & 1U) == 0) {
                        if ((_rtspreq->state).infilesize == -1) {
                          if ((_rtspreq->set).postfields == (void *)0x0) {
                            local_148 = 0;
                          }
                          else {
                            local_148 = strlen((char *)(_rtspreq->set).postfields);
                          }
                          local_140 = local_148;
                        }
                        else {
                          local_140 = (_rtspreq->state).infilesize;
                        }
                        putsize = local_140;
                        (_rtspreq->set).httpreq = HTTPREQ_POST;
                      }
                      else {
                        p_request = (char *)(_rtspreq->state).infilesize;
                        (_rtspreq->set).httpreq = HTTPREQ_PUT;
                      }
                      if (((long)p_request < 1) && (putsize < 1)) {
                        if ((Curl_RtspReq)rtsp == RTSPREQ_GET_PARAMETER) {
                          (_rtspreq->set).httpreq = HTTPREQ_HEAD;
                          (_rtspreq->set).opt_no_body = true;
                        }
                      }
                      else {
                        pcVar4 = Curl_checkheaders((connectdata *)done_local,"Content-Length");
                        if (pcVar4 == (char *)0x0) {
                          if (((_rtspreq->set).upload & 1U) == 0) {
                            local_150 = (char *)putsize;
                          }
                          else {
                            local_150 = p_request;
                          }
                          CVar1 = Curl_add_bufferf((Curl_send_buffer **)&postsize,
                                                   "Content-Length: %ld\r\n",local_150);
                          if (CVar1 != CURLE_OK) {
                            return CVar1;
                          }
                          rtsp._4_4_ = CURLE_OK;
                        }
                        if ((((Curl_RtspReq)rtsp == RTSPREQ_SET_PARAMETER) ||
                            ((Curl_RtspReq)rtsp == RTSPREQ_GET_PARAMETER)) &&
                           (pcVar4 = Curl_checkheaders((connectdata *)done_local,"Content-Type"),
                           pcVar4 == (char *)0x0)) {
                          CVar1 = Curl_add_bufferf((Curl_send_buffer **)&postsize,
                                                   "Content-Type: text/parameters\r\n");
                          if (CVar1 != CURLE_OK) {
                            return CVar1;
                          }
                          rtsp._4_4_ = CURLE_OK;
                        }
                        if (((Curl_RtspReq)rtsp == RTSPREQ_ANNOUNCE) &&
                           (pcVar4 = Curl_checkheaders((connectdata *)done_local,"Content-Type"),
                           pcVar4 == (char *)0x0)) {
                          CVar1 = Curl_add_bufferf((Curl_send_buffer **)&postsize,
                                                   "Content-Type: application/sdp\r\n");
                          if (CVar1 != CURLE_OK) {
                            return CVar1;
                          }
                          rtsp._4_4_ = CURLE_OK;
                        }
                        (_rtspreq->state).expect100header = false;
                      }
                    }
                    (_rtspreq->req).forbidchunk = true;
                    rtsp._4_4_ = Curl_add_buffer((Curl_send_buffer **)&postsize,"\r\n",2);
                    conn_local._4_4_ = rtsp._4_4_;
                    if ((rtsp._4_4_ == CURLE_OK) &&
                       ((putsize < 1 ||
                        (conn_local._4_4_ =
                              Curl_add_buffer((Curl_send_buffer **)&postsize,
                                              (_rtspreq->set).postfields,putsize),
                        conn_local._4_4_ == CURLE_OK)))) {
                      rtsp._4_4_ = 0;
                      rtsp._4_4_ = Curl_add_buffer_send
                                             ((Curl_send_buffer **)&postsize,
                                              (connectdata *)done_local,
                                              &(_rtspreq->info).request_size,0,0);
                      if (rtsp._4_4_ == CURLE_OK) {
                        iVar2 = -1;
                        if (p_request == (char *)0x0) {
                          local_170 = (Curl_send_buffer *)0x0;
                        }
                        else {
                          iVar2 = 0;
                          local_170 = req_buffer + 2;
                        }
                        Curl_setup_transfer((connectdata *)done_local,0,-1,true,
                                            (curl_off_t *)&req_buffer[1].size_used,iVar2,
                                            (curl_off_t *)local_170);
                        (_rtspreq->state).rtsp_next_client_CSeq =
                             (_rtspreq->state).rtsp_next_client_CSeq + 1;
                        if (req_buffer[2].buffer != (char *)0x0) {
                          Curl_pgrsSetUploadCounter(_rtspreq,(curl_off_t)req_buffer[2].buffer);
                          iVar2 = Curl_pgrsUpdate((connectdata *)done_local);
                          if (iVar2 != 0) {
                            rtsp._4_4_ = CURLE_ABORTED_BY_CALLBACK;
                          }
                        }
                        conn_local._4_4_ = rtsp._4_4_;
                      }
                      else {
                        Curl_failf(_rtspreq,"Failed sending RTSP request");
                        conn_local._4_4_ = rtsp._4_4_;
                      }
                    }
                  }
                }
                else {
                  conn_local._4_4_ = rtsp._4_4_;
                }
              }
            }
          }
          else {
            Curl_failf(_rtspreq,"Session ID cannot be set as a custom header.");
            conn_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
          }
        }
        else {
          Curl_failf(_rtspreq,"CSeq cannot be set as a custom header.");
          conn_local._4_4_ = CURLE_RTSP_CSEQ_ERROR;
        }
      }
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode rtsp_do(struct connectdata *conn, bool *done)
{
  struct Curl_easy *data = conn->data;
  CURLcode result = CURLE_OK;
  Curl_RtspReq rtspreq = data->set.rtspreq;
  struct RTSP *rtsp = data->req.protop;
  struct HTTP *http;
  Curl_send_buffer *req_buffer;
  curl_off_t postsize = 0; /* for ANNOUNCE and SET_PARAMETER */
  curl_off_t putsize = 0; /* for ANNOUNCE and SET_PARAMETER */

  const char *p_request = NULL;
  const char *p_session_id = NULL;
  const char *p_accept = NULL;
  const char *p_accept_encoding = NULL;
  const char *p_range = NULL;
  const char *p_referrer = NULL;
  const char *p_stream_uri = NULL;
  const char *p_transport = NULL;
  const char *p_uagent = NULL;
  const char *p_proxyuserpwd = NULL;
  const char *p_userpwd = NULL;

  *done = TRUE;

  http = &(rtsp->http_wrapper);
  /* Assert that no one has changed the RTSP struct in an evil way */
  DEBUGASSERT((void *)http == (void *)rtsp);

  rtsp->CSeq_sent = data->state.rtsp_next_client_CSeq;
  rtsp->CSeq_recv = 0;

  /* Setup the 'p_request' pointer to the proper p_request string
   * Since all RTSP requests are included here, there is no need to
   * support custom requests like HTTP.
   **/
  data->set.opt_no_body = TRUE; /* most requests don't contain a body */
  switch(rtspreq) {
  default:
    failf(data, "Got invalid RTSP request");
    return CURLE_BAD_FUNCTION_ARGUMENT;
  case RTSPREQ_OPTIONS:
    p_request = "OPTIONS";
    break;
  case RTSPREQ_DESCRIBE:
    p_request = "DESCRIBE";
    data->set.opt_no_body = FALSE;
    break;
  case RTSPREQ_ANNOUNCE:
    p_request = "ANNOUNCE";
    break;
  case RTSPREQ_SETUP:
    p_request = "SETUP";
    break;
  case RTSPREQ_PLAY:
    p_request = "PLAY";
    break;
  case RTSPREQ_PAUSE:
    p_request = "PAUSE";
    break;
  case RTSPREQ_TEARDOWN:
    p_request = "TEARDOWN";
    break;
  case RTSPREQ_GET_PARAMETER:
    /* GET_PARAMETER's no_body status is determined later */
    p_request = "GET_PARAMETER";
    data->set.opt_no_body = FALSE;
    break;
  case RTSPREQ_SET_PARAMETER:
    p_request = "SET_PARAMETER";
    break;
  case RTSPREQ_RECORD:
    p_request = "RECORD";
    break;
  case RTSPREQ_RECEIVE:
    p_request = "";
    /* Treat interleaved RTP as body*/
    data->set.opt_no_body = FALSE;
    break;
  case RTSPREQ_LAST:
    failf(data, "Got invalid RTSP request: RTSPREQ_LAST");
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }

  if(rtspreq == RTSPREQ_RECEIVE) {
    Curl_setup_transfer(conn, FIRSTSOCKET, -1, TRUE,
                        &http->readbytecount, -1, NULL);

    return result;
  }

  p_session_id = data->set.str[STRING_RTSP_SESSION_ID];
  if(!p_session_id &&
     (rtspreq & ~(RTSPREQ_OPTIONS | RTSPREQ_DESCRIBE | RTSPREQ_SETUP))) {
    failf(data, "Refusing to issue an RTSP request [%s] without a session ID.",
          p_request);
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }

  /* TODO: proxy? */

  /* Stream URI. Default to server '*' if not specified */
  if(data->set.str[STRING_RTSP_STREAM_URI]) {
    p_stream_uri = data->set.str[STRING_RTSP_STREAM_URI];
  }
  else {
    p_stream_uri = "*";
  }

  /* Transport Header for SETUP requests */
  p_transport = Curl_checkheaders(conn, "Transport");
  if(rtspreq == RTSPREQ_SETUP && !p_transport) {
    /* New Transport: setting? */
    if(data->set.str[STRING_RTSP_TRANSPORT]) {
      Curl_safefree(conn->allocptr.rtsp_transport);

      conn->allocptr.rtsp_transport =
        aprintf("Transport: %s\r\n",
                data->set.str[STRING_RTSP_TRANSPORT]);
      if(!conn->allocptr.rtsp_transport)
        return CURLE_OUT_OF_MEMORY;
    }
    else {
      failf(data,
            "Refusing to issue an RTSP SETUP without a Transport: header.");
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }

    p_transport = conn->allocptr.rtsp_transport;
  }

  /* Accept Headers for DESCRIBE requests */
  if(rtspreq == RTSPREQ_DESCRIBE) {
    /* Accept Header */
    p_accept = Curl_checkheaders(conn, "Accept")?
      NULL:"Accept: application/sdp\r\n";

    /* Accept-Encoding header */
    if(!Curl_checkheaders(conn, "Accept-Encoding") &&
       data->set.str[STRING_ENCODING]) {
      Curl_safefree(conn->allocptr.accept_encoding);
      conn->allocptr.accept_encoding =
        aprintf("Accept-Encoding: %s\r\n", data->set.str[STRING_ENCODING]);

      if(!conn->allocptr.accept_encoding)
        return CURLE_OUT_OF_MEMORY;

      p_accept_encoding = conn->allocptr.accept_encoding;
    }
  }

  /* The User-Agent string might have been allocated in url.c already, because
     it might have been used in the proxy connect, but if we have got a header
     with the user-agent string specified, we erase the previously made string
     here. */
  if(Curl_checkheaders(conn, "User-Agent") && conn->allocptr.uagent) {
    Curl_safefree(conn->allocptr.uagent);
    conn->allocptr.uagent = NULL;
  }
  else if(!Curl_checkheaders(conn, "User-Agent") &&
          data->set.str[STRING_USERAGENT]) {
    p_uagent = conn->allocptr.uagent;
  }

  /* setup the authentication headers */
  result = Curl_http_output_auth(conn, p_request, p_stream_uri, FALSE);
  if(result)
    return result;

  p_proxyuserpwd = conn->allocptr.proxyuserpwd;
  p_userpwd = conn->allocptr.userpwd;

  /* Referrer */
  Curl_safefree(conn->allocptr.ref);
  if(data->change.referer && !Curl_checkheaders(conn, "Referer"))
    conn->allocptr.ref = aprintf("Referer: %s\r\n", data->change.referer);
  else
    conn->allocptr.ref = NULL;

  p_referrer = conn->allocptr.ref;

  /*
   * Range Header
   * Only applies to PLAY, PAUSE, RECORD
   *
   * Go ahead and use the Range stuff supplied for HTTP
   */
  if(data->state.use_range &&
     (rtspreq  & (RTSPREQ_PLAY | RTSPREQ_PAUSE | RTSPREQ_RECORD))) {

    /* Check to see if there is a range set in the custom headers */
    if(!Curl_checkheaders(conn, "Range") && data->state.range) {
      Curl_safefree(conn->allocptr.rangeline);
      conn->allocptr.rangeline = aprintf("Range: %s\r\n", data->state.range);
      p_range = conn->allocptr.rangeline;
    }
  }

  /*
   * Sanity check the custom headers
   */
  if(Curl_checkheaders(conn, "CSeq")) {
    failf(data, "CSeq cannot be set as a custom header.");
    return CURLE_RTSP_CSEQ_ERROR;
  }
  if(Curl_checkheaders(conn, "Session")) {
    failf(data, "Session ID cannot be set as a custom header.");
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }

  /* Initialize a dynamic send buffer */
  req_buffer = Curl_add_buffer_init();

  if(!req_buffer)
    return CURLE_OUT_OF_MEMORY;

  result =
    Curl_add_bufferf(&req_buffer,
                     "%s %s RTSP/1.0\r\n" /* Request Stream-URI RTSP/1.0 */
                     "CSeq: %ld\r\n", /* CSeq */
                     p_request, p_stream_uri, rtsp->CSeq_sent);
  if(result)
    return result;

  /*
   * Rather than do a normal alloc line, keep the session_id unformatted
   * to make comparison easier
   */
  if(p_session_id) {
    result = Curl_add_bufferf(&req_buffer, "Session: %s\r\n", p_session_id);
    if(result)
      return result;
  }

  /*
   * Shared HTTP-like options
   */
  result = Curl_add_bufferf(&req_buffer,
                            "%s" /* transport */
                            "%s" /* accept */
                            "%s" /* accept-encoding */
                            "%s" /* range */
                            "%s" /* referrer */
                            "%s" /* user-agent */
                            "%s" /* proxyuserpwd */
                            "%s" /* userpwd */
                            ,
                            p_transport ? p_transport : "",
                            p_accept ? p_accept : "",
                            p_accept_encoding ? p_accept_encoding : "",
                            p_range ? p_range : "",
                            p_referrer ? p_referrer : "",
                            p_uagent ? p_uagent : "",
                            p_proxyuserpwd ? p_proxyuserpwd : "",
                            p_userpwd ? p_userpwd : "");

  /*
   * Free userpwd now --- cannot reuse this for Negotiate and possibly NTLM
   * with basic and digest, it will be freed anyway by the next request
   */
  Curl_safefree(conn->allocptr.userpwd);
  conn->allocptr.userpwd = NULL;

  if(result)
    return result;

  if((rtspreq == RTSPREQ_SETUP) || (rtspreq == RTSPREQ_DESCRIBE)) {
    result = Curl_add_timecondition(data, req_buffer);
    if(result)
      return result;
  }

  result = Curl_add_custom_headers(conn, FALSE, req_buffer);
  if(result)
    return result;

  if(rtspreq == RTSPREQ_ANNOUNCE ||
     rtspreq == RTSPREQ_SET_PARAMETER ||
     rtspreq == RTSPREQ_GET_PARAMETER) {

    if(data->set.upload) {
      putsize = data->state.infilesize;
      data->set.httpreq = HTTPREQ_PUT;

    }
    else {
      postsize = (data->state.infilesize != -1)?
        data->state.infilesize:
        (data->set.postfields? (curl_off_t)strlen(data->set.postfields):0);
      data->set.httpreq = HTTPREQ_POST;
    }

    if(putsize > 0 || postsize > 0) {
      /* As stated in the http comments, it is probably not wise to
       * actually set a custom Content-Length in the headers */
      if(!Curl_checkheaders(conn, "Content-Length")) {
        result =
          Curl_add_bufferf(&req_buffer,
                           "Content-Length: %" CURL_FORMAT_CURL_OFF_T"\r\n",
                           (data->set.upload ? putsize : postsize));
        if(result)
          return result;
      }

      if(rtspreq == RTSPREQ_SET_PARAMETER ||
         rtspreq == RTSPREQ_GET_PARAMETER) {
        if(!Curl_checkheaders(conn, "Content-Type")) {
          result = Curl_add_bufferf(&req_buffer,
                                    "Content-Type: text/parameters\r\n");
          if(result)
            return result;
        }
      }

      if(rtspreq == RTSPREQ_ANNOUNCE) {
        if(!Curl_checkheaders(conn, "Content-Type")) {
          result = Curl_add_bufferf(&req_buffer,
                                    "Content-Type: application/sdp\r\n");
          if(result)
            return result;
        }
      }

      data->state.expect100header = FALSE; /* RTSP posts are simple/small */
    }
    else if(rtspreq == RTSPREQ_GET_PARAMETER) {
      /* Check for an empty GET_PARAMETER (heartbeat) request */
      data->set.httpreq = HTTPREQ_HEAD;
      data->set.opt_no_body = TRUE;
    }
  }

  /* RTSP never allows chunked transfer */
  data->req.forbidchunk = TRUE;
  /* Finish the request buffer */
  result = Curl_add_buffer(&req_buffer, "\r\n", 2);
  if(result)
    return result;

  if(postsize > 0) {
    result = Curl_add_buffer(&req_buffer, data->set.postfields,
                             (size_t)postsize);
    if(result)
      return result;
  }

  /* issue the request */
  result = Curl_add_buffer_send(&req_buffer, conn,
                                &data->info.request_size, 0, FIRSTSOCKET);
  if(result) {
    failf(data, "Failed sending RTSP request");
    return result;
  }

  Curl_setup_transfer(conn, FIRSTSOCKET, -1, TRUE, &http->readbytecount,
                      putsize?FIRSTSOCKET:-1,
                      putsize?&http->writebytecount:NULL);

  /* Increment the CSeq on success */
  data->state.rtsp_next_client_CSeq++;

  if(http->writebytecount) {
    /* if a request-body has been sent off, we make sure this progress is
       noted properly */
    Curl_pgrsSetUploadCounter(data, http->writebytecount);
    if(Curl_pgrsUpdate(conn))
      result = CURLE_ABORTED_BY_CALLBACK;
  }

  return result;
}